

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch.hpp
# Opt level: O2

Array __thiscall notch::core::SoftmaxWithLoss::softmax(SoftmaxWithLoss *this,Array *input)

{
  size_t sVar1;
  float *pfVar2;
  element_type *peVar3;
  size_t i;
  size_t sVar4;
  float *extraout_RDX;
  size_t i_1;
  float fVar5;
  float fVar6;
  Array AVar7;
  float expTotalInv;
  float local_30;
  float local_2c;
  
  local_2c = 0.0;
  std::valarray<float>::valarray((valarray<float> *)this,&local_2c,input->_M_size);
  sVar1 = input->_M_size;
  pfVar2 = input->_M_data;
  fVar6 = 1.1754944e-38;
  for (sVar4 = 0; sVar1 != sVar4; sVar4 = sVar4 + 1) {
    fVar5 = pfVar2[sVar4];
    if (fVar5 <= fVar6) {
      fVar5 = fVar6;
    }
    fVar6 = fVar5;
  }
  peVar3 = (this->super_ALossLayer).shared.inputBuffer.
           super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_30 = 0.0;
  for (sVar4 = 0; sVar1 != sVar4; sVar4 = sVar4 + 1) {
    fVar5 = expf(pfVar2[sVar4] - fVar6);
    *(float *)((long)&peVar3->_M_size + sVar4 * 4) = fVar5;
    local_30 = local_30 + fVar5;
  }
  local_30 = 1.0 / local_30;
  std::valarray<float>::operator*=((valarray<float> *)this,&local_30);
  AVar7._M_data = extraout_RDX;
  AVar7._M_size = (size_t)this;
  return AVar7;
}

Assistant:

static Array softmax(const Array &input) {
        Array softmaxOutput(0.0, input.size());
        size_t nSize = input.size();
        // a trick to avoid unbounded exponents
        float maxInput = std::numeric_limits<float>::min();
        for (size_t i = 0; i < nSize; ++i) {
            if (input[i] > maxInput) {
                maxInput = input[i];
            }
        }
        // calculate exponents
        float expTotal = 0.0;
        for (size_t i = 0; i < nSize; ++i) { // calculate exponents
            softmaxOutput[i] = std::exp(input[i] - maxInput);
            expTotal += softmaxOutput[i];
        }
        // normalize exponents
        float expTotalInv = 1.0/expTotal;
        softmaxOutput *= expTotalInv;
        return softmaxOutput;
    }